

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateEnumValueDocComment
               (Printer *printer,EnumValueDescriptor *value)

{
  EnumValueDescriptor *this;
  string local_78;
  string local_58;
  string local_38;
  EnumValueDescriptor *local_18;
  EnumValueDescriptor *value_local;
  Printer *printer_local;
  
  local_18 = value;
  value_local = (EnumValueDescriptor *)printer;
  io::Printer::Print(printer,"/**\n");
  GenerateDocCommentBody<google::protobuf::EnumValueDescriptor>((Printer *)value_local,local_18);
  this = value_local;
  EnumValueDescriptor::DebugString_abi_cxx11_(&local_78,local_18);
  FirstLineOf(&local_58,&local_78);
  EscapePhpdoc(&local_38,&local_58);
  io::Printer::Print((Printer *)this," * <code>^def^</code>\n */\n","def",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void GenerateEnumValueDocComment(io::Printer* printer,
                                 const EnumValueDescriptor* value) {
  printer->Print("/**\n");
  GenerateDocCommentBody(printer, value);
  printer->Print(
    " * <code>^def^</code>\n"
    " */\n",
    "def", EscapePhpdoc(FirstLineOf(value->DebugString())));
}